

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

measurement units::measurement_cast_from_string(string *measurement_string,uint64_t match_flags)

{
  measurement mVar1;
  string local_60;
  precise_measurement local_40;
  uint64_t local_28;
  uint64_t match_flags_local;
  string *measurement_string_local;
  unit local_10;
  
  local_28 = match_flags;
  match_flags_local = (uint64_t)measurement_string;
  std::__cxx11::string::string((string *)&local_60,(string *)measurement_string);
  measurement_from_string(&local_40,&local_60,local_28);
  mVar1 = measurement_cast(&local_40);
  local_10 = mVar1.units_;
  measurement_string_local = (string *)mVar1.value_;
  std::__cxx11::string::~string((string *)&local_60);
  mVar1.units_ = local_10;
  mVar1.value_ = (double)measurement_string_local;
  return mVar1;
}

Assistant:

inline measurement measurement_cast_from_string(
    std::string measurement_string,
    std::uint64_t match_flags = getDefaultFlags())
{
    return measurement_cast(
        measurement_from_string(std::move(measurement_string), match_flags));
}